

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<std::complex<double>_>::ReallocForNuma(TPZVec<std::complex<double>_> *this)

{
  ulong uVar1;
  complex<double> *__src;
  complex<double> *__dest;
  
  uVar1 = this->fNElements;
  if ((uVar1 != 0) && (__src = this->fStore, __src != (complex<double> *)0x0)) {
    __dest = (complex<double> *)operator_new__(-(ulong)(uVar1 >> 0x3c != 0) | uVar1 << 4);
    memcpy(__dest,__src,uVar1 << 4);
    operator_delete__(__src);
    this->fStore = __dest;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}